

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void uv__fs_done(uv__work *w,int status)

{
  int in_ESI;
  long in_RDI;
  uv_fs_t *req;
  
  if (*(long *)(in_RDI + -0x110) + 0x20 == *(long *)(*(long *)(in_RDI + -0x110) + 0x20)) {
    __assert_fail("uv__has_active_reqs(req->loop)","src/unix/fs.c",0x29e,
                  "void uv__fs_done(struct uv__work *, int)");
  }
  **(undefined8 **)(in_RDI + -0x120) = *(undefined8 *)(in_RDI + -0x128);
  *(undefined8 *)(*(long *)(in_RDI + -0x128) + 8) = *(undefined8 *)(in_RDI + -0x120);
  if (in_ESI == -0x7d) {
    if (*(long *)(in_RDI + -0x100) != 0) {
      __assert_fail("req->result == 0","src/unix/fs.c",0x2a1,
                    "void uv__fs_done(struct uv__work *, int)");
    }
    *(undefined8 *)(in_RDI + -0x100) = 0xffffffffffffff83;
  }
  if (*(long *)(in_RDI + -0x108) != 0) {
    (**(code **)(in_RDI + -0x108))(in_RDI + -0x138);
  }
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == -ECANCELED) {
    assert(req->result == 0);
    req->result = -ECANCELED;
  }

  if (req->cb != NULL)
    req->cb(req);
}